

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinSplitLimit
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  initializer_list<jsonnet::internal::(anonymous_namespace)::Value::Type> __l;
  bool bVar1;
  const_reference pvVar2;
  void **args_1;
  void **ppvVar3;
  size_type sVar4;
  _Base_ptr in_RDX;
  long in_RDI;
  Value VVar5;
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  *in_stack_00000080;
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  *in_stack_00000088;
  string *in_stack_00000090;
  LocationRange *in_stack_00000098;
  Interpreter *in_stack_000000a0;
  HeapThunk *th;
  HeapThunk *th_1;
  vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  *elements;
  uint test;
  uint start;
  long maxsplits;
  HeapString *c;
  HeapString *str;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
  *in_stack_fffffffffffffd98;
  anon_union_8_3_4e909c26_for_v v;
  Interpreter *in_stack_fffffffffffffda0;
  Interpreter *pIVar6;
  value_type *in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb4;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
  *in_stack_fffffffffffffdb8;
  allocator_type *in_stack_fffffffffffffdc8;
  allocator<char> *in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde0;
  void **in_stack_fffffffffffffe00;
  undefined7 in_stack_fffffffffffffe08;
  undefined1 in_stack_fffffffffffffe0f;
  uint7 in_stack_fffffffffffffe18;
  undefined1 uVar7;
  undefined1 local_1a0 [200];
  undefined1 local_d8 [32];
  Type local_b8;
  undefined4 uStack_b4;
  anon_union_8_3_4e909c26_for_v local_b0;
  uint local_a8;
  uint local_a4;
  void **local_a0;
  anon_union_8_3_4e909c26_for_v local_98;
  anon_union_8_3_4e909c26_for_v local_90;
  undefined1 local_84 [75];
  allocator<char> local_39;
  string local_38 [32];
  _Base_ptr local_18;
  
  local_18 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffde0,
             (char *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
             in_stack_fffffffffffffdd0);
  local_84._0_4_ = 0x13;
  local_84._4_4_ = 0x13;
  local_84._8_4_ = 2;
  local_84._12_8_ = local_84;
  local_84._20_8_ = (pointer)0x3;
  std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>::allocator
            ((allocator<jsonnet::internal::(anonymous_namespace)::Value::Type> *)0x2d0914);
  __l._M_array._4_4_ = in_stack_fffffffffffffddc;
  __l._M_array._0_4_ = in_stack_fffffffffffffdd8;
  __l._M_len = (size_type)in_stack_fffffffffffffde0;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::vector((vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
            *)in_stack_fffffffffffffdd0,__l,in_stack_fffffffffffffdc8);
  validateBuiltinArgs(in_stack_000000a0,in_stack_00000098,in_stack_00000090,in_stack_00000088,
                      in_stack_00000080);
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::~vector((vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
             *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
  std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>::~allocator
            ((allocator<jsonnet::internal::(anonymous_namespace)::Value::Type> *)0x2d0984);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  pvVar2 = std::
           vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           ::operator[]((vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
                         *)local_18,0);
  local_90 = pvVar2->v;
  pvVar2 = std::
           vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           ::operator[]((vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
                         *)local_18,1);
  local_98 = pvVar2->v;
  pvVar2 = std::
           vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           ::operator[]((vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
                         *)local_18,2);
  local_a0 = (void **)(long)(pvVar2->v).d;
  local_a4 = 0;
  local_a8 = 0;
  local_d8._0_8_ = 0;
  local_d8._8_8_ = 0.0;
  local_d8._16_8_ = (_Base_ptr)0x0;
  pIVar6 = (Interpreter *)local_d8;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  ::vector((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
            *)0x2d0a3b);
  VVar5 = makeArray(in_stack_fffffffffffffda0,
                    (vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                     *)in_stack_fffffffffffffd98);
  local_b0 = VVar5.v;
  local_b8 = VVar5.t;
  *(ulong *)(in_RDI + 0x40) = CONCAT44(uStack_b4,local_b8);
  *(anon_union_8_3_4e909c26_for_v *)(in_RDI + 0x48) = local_b0;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  ::~vector((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
             *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
  local_1a0._192_8_ = *(long *)(in_RDI + 0x48) + 0x10;
  while( true ) {
    args_1 = (void **)(ulong)local_a8;
    ppvVar3 = (void **)std::__cxx11::
                       basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                       ::size((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                               *)(local_90.h + 1));
    uVar7 = false;
    if ((args_1 < ppvVar3) &&
       (in_stack_fffffffffffffe0f = true, uVar7 = in_stack_fffffffffffffe0f,
       local_a0 != (void **)0xffffffffffffffff)) {
      in_stack_fffffffffffffe00 = local_a0;
      ppvVar3 = (void **)std::
                         vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                         ::size((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                                 *)local_1a0._192_8_);
      in_stack_fffffffffffffe0f = ppvVar3 < in_stack_fffffffffffffe00;
      uVar7 = in_stack_fffffffffffffe0f;
    }
    if ((bool)uVar7 == false) break;
    std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
    size((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
         (local_98.h + 1));
    std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
    substr(in_stack_fffffffffffffdb8,CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
           (size_type)in_stack_fffffffffffffda8);
    bVar1 = std::operator==((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                             *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    std::__cxx11::u32string::~u32string
              ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
               in_stack_fffffffffffffda0);
    if (bVar1) {
      local_1a0._144_8_ = (Identifier *)0x0;
      local_1a0._140_4_ = 0;
      local_1a0._128_8_ = (Identifier *)0x0;
      local_1a0._152_8_ =
           (anonymous_namespace)::Interpreter::
           makeHeap<jsonnet::internal::(anonymous_namespace)::HeapThunk,jsonnet::internal::Identifier_const*&,decltype(nullptr),int,decltype(nullptr)>
                     (pIVar6,(Identifier **)CONCAT17(uVar7,in_stack_fffffffffffffe18),args_1,
                      (int *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
                      in_stack_fffffffffffffe00);
      std::
      vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
      ::push_back((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                   *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                  in_stack_fffffffffffffda8);
      std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
      substr(in_stack_fffffffffffffdb8,CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0)
             ,(size_type)in_stack_fffffffffffffda8);
      VVar5 = makeString(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
      local_1a0._120_8_ = VVar5.v;
      local_1a0._112_4_ = VVar5.t;
      HeapThunk::fill((HeapThunk *)in_stack_fffffffffffffda0,(Value *)in_stack_fffffffffffffd98);
      std::__cxx11::u32string::~u32string
                ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                 in_stack_fffffffffffffda0);
      in_stack_fffffffffffffdb8 =
           (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
           (ulong)local_a8;
      sVar4 = std::__cxx11::
              basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::size
                        ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                          *)(local_98.h + 1));
      local_a8 = (int)in_stack_fffffffffffffdb8 + (int)sVar4;
      local_a4 = local_a8;
    }
    else {
      local_a8 = local_a8 + 1;
    }
  }
  local_1a0._64_8_ = 0;
  local_1a0._60_4_ = 0;
  local_1a0._48_8_ = 0;
  local_1a0._72_8_ =
       (anonymous_namespace)::Interpreter::
       makeHeap<jsonnet::internal::(anonymous_namespace)::HeapThunk,jsonnet::internal::Identifier_const*&,decltype(nullptr),int,decltype(nullptr)>
                 (pIVar6,(Identifier **)(ulong)in_stack_fffffffffffffe18,args_1,
                  (int *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
                  in_stack_fffffffffffffe00);
  std::
  vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  ::push_back((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
               *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
              in_stack_fffffffffffffda8);
  pIVar6 = (Interpreter *)local_1a0;
  v = (anon_union_8_3_4e909c26_for_v)local_1a0._72_8_;
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  substr(in_stack_fffffffffffffdb8,CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
         (size_type)in_stack_fffffffffffffda8);
  VVar5 = makeString(pIVar6,(UString *)v.h);
  local_1a0._40_8_ = VVar5.v;
  local_1a0._32_4_ = VVar5.t;
  HeapThunk::fill((HeapThunk *)pIVar6,(Value *)v.h);
  std::__cxx11::u32string::~u32string
            ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)pIVar6
            );
  return (AST *)0x0;
}

Assistant:

const AST *builtinSplitLimit(const LocationRange &loc, const std::vector<Value> &args)
    {
        validateBuiltinArgs(loc, "splitLimit", args, {Value::STRING, Value::STRING, Value::NUMBER});
        const auto *str = static_cast<const HeapString *>(args[0].v.h);
        const auto *c = static_cast<const HeapString *>(args[1].v.h);
        long maxsplits = long(args[2].v.d);
        unsigned start = 0;
        unsigned test = 0;
        scratch = makeArray({});
        auto &elements = static_cast<HeapArray *>(scratch.v.h)->elements;
        while (test < str->value.size() && (maxsplits == -1 ||
                                            size_t(maxsplits) > elements.size())) {
            if (c->value == str->value.substr(test, c->value.size())) {
                auto *th = makeHeap<HeapThunk>(idArrayElement, nullptr, 0, nullptr);
                elements.push_back(th);
                th->fill(makeString(str->value.substr(start, test - start)));
                start = test + c->value.size();
                test = start;
            } else {
                ++test;
            }
        }
        auto *th = makeHeap<HeapThunk>(idArrayElement, nullptr, 0, nullptr);
        elements.push_back(th);
        th->fill(makeString(str->value.substr(start)));

        return nullptr;
    }